

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::ClipControlBaseTest::verifyState(ClipControlBaseTest *this,GLenum origin,GLenum depth)

{
  GLenum GVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  GLint retI;
  GLenum local_2c;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x868))(0x935c,&local_2c);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"get GL_CLIP_ORIGIN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
                  ,0x69);
  GVar1 = local_2c;
  (**(code **)(lVar4 + 0x868))(0x935d,&local_2c);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"get GL_CLIP_DEPTH_MODE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
                  ,0x6e);
  return depth == local_2c && origin == GVar1;
}

Assistant:

bool verifyState(glw::GLenum origin, glw::GLenum depth)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		bool ret = true;

		glw::GLint retI;
		gl.getIntegerv(GL_CLIP_ORIGIN, &retI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get GL_CLIP_ORIGIN");

		ret &= (static_cast<glw::GLenum>(retI) == origin);

		gl.getIntegerv(GL_CLIP_DEPTH_MODE, &retI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get GL_CLIP_DEPTH_MODE");

		ret &= (static_cast<glw::GLenum>(retI) == depth);

		return ret;
	}